

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreadtetgen.cpp
# Opt level: O0

bool __thiscall
TPZReadTetGen::ProcessFaces
          (TPZReadTetGen *this,string *FaceFileName,TPZGeoMesh *gmesh,int64_t *numberfaces)

{
  char *pcVar1;
  void *pvVar2;
  mapped_type_conflict *pmVar3;
  long *plVar4;
  long *in_RCX;
  long *in_RDX;
  int64_t i;
  TPZManVector<long,_3> nodind;
  int64_t index;
  int64_t NO3;
  int64_t NO2;
  int64_t NO1;
  int64_t mat;
  int64_t ID;
  int64_t BoundMarker;
  int64_t nfaces;
  ifstream FaceFile;
  TPZManVector<long,_3> *in_stack_fffffffffffffcd0;
  int64_t in_stack_fffffffffffffce8;
  mapped_type_conflict mVar5;
  TPZManVector<long,_3> *in_stack_fffffffffffffcf0;
  long *in_stack_fffffffffffffd08;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd10;
  long local_2b8;
  TPZVec<long> local_2a0;
  undefined1 local_268 [8];
  long local_260;
  long local_258;
  long local_250;
  ulong local_248;
  long local_240;
  long local_238;
  long local_230;
  undefined1 local_228 [520];
  long *local_20;
  long *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,pcVar1,_S_in);
  TPZManVector<long,_3>::TPZManVector(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  pvVar2 = (void *)std::istream::operator>>(local_228,&local_230);
  std::istream::operator>>(pvVar2,&local_238);
  *local_20 = local_230;
  for (local_2b8 = 0; local_2b8 < local_230; local_2b8 = local_2b8 + 1) {
    pvVar2 = (void *)std::istream::operator>>(local_228,&local_240);
    pvVar2 = (void *)std::istream::operator>>(pvVar2,&local_250);
    pvVar2 = (void *)std::istream::operator>>(pvVar2,&local_258);
    std::istream::operator>>(pvVar2,&local_260);
    if (local_238 == 0) {
      local_248 = 0xffffffffffffffff;
    }
    else {
      std::istream::operator>>(local_228,(long *)&local_248);
    }
    in_stack_fffffffffffffd10 =
         (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    mVar5 = *(mapped_type_conflict *)&(in_stack_fffffffffffffd10->_M_t)._M_impl;
    in_stack_fffffffffffffd08 = TPZVec<long>::operator[](&local_2a0,0);
    *in_stack_fffffffffffffd08 = mVar5;
    pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    mVar5 = *pmVar3;
    plVar4 = TPZVec<long>::operator[](&local_2a0,1);
    *plVar4 = mVar5;
    pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    in_stack_fffffffffffffcd0 = (TPZManVector<long,_3> *)*pmVar3;
    plVar4 = TPZVec<long>::operator[](&local_2a0,2);
    *plVar4 = (long)in_stack_fffffffffffffcd0;
    (**(code **)(*local_18 + 0x60))(local_18,2,&local_2a0,local_248 & 0xffffffff,local_268,1);
  }
  TPZManVector<long,_3>::~TPZManVector(in_stack_fffffffffffffcd0);
  std::ifstream::~ifstream(local_228);
  return true;
}

Assistant:

bool TPZReadTetGen::ProcessFaces(std::string FaceFileName,  TPZGeoMesh &gmesh, int64_t & numberfaces){
	
	std::ifstream FaceFile(FaceFileName.c_str());
	
	int64_t nfaces, BoundMarker, ID, mat;
	int64_t NO1, NO2, NO3, index;
	TPZManVector<int64_t,3> nodind(3);
	//TPZGeoEl * gel;
	
	FaceFile >> nfaces >> BoundMarker;
	
	numberfaces = nfaces;
	
	for(int64_t i = 0; i < nfaces; i++){
		FaceFile >> ID >> NO1 >> NO2 >> NO3;
		if (BoundMarker) FaceFile >> mat;
		else mat = -1;
		nodind[0] = this->fNodeIndices[ NO1 ];
		nodind[1] = this->fNodeIndices[ NO2 ];
		nodind[2] = this->fNodeIndices[ NO3 ];
		/*gel = */gmesh.CreateGeoElement(ETriangle, nodind, mat, index);
	}//for i
	
	return true;
	
}